

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerMSL::to_swizzle_expression_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,uint32_t id)

{
  uint32_t id_00;
  ulong uVar1;
  ulong uVar2;
  undefined1 *puVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  undefined1 local_b0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> array_expr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> image_expr;
  size_type period;
  size_type index;
  undefined1 local_48 [8];
  string expr;
  SPIRCombinedImageSampler *combined;
  uint32_t id_local;
  CompilerMSL *this_local;
  
  expr.field_2._8_8_ =
       Compiler::maybe_get<spirv_cross::SPIRCombinedImageSampler>((Compiler *)this,id);
  if ((SPIRCombinedImageSampler *)expr.field_2._8_8_ == (SPIRCombinedImageSampler *)0x0) {
    TypedID<(spirv_cross::Types)2>::TypedID((TypedID<(spirv_cross::Types)2> *)((long)&index + 4),id)
    ;
  }
  else {
    index._4_4_ = (((SPIRCombinedImageSampler *)expr.field_2._8_8_)->image).id;
  }
  id_00 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&index + 4));
  CompilerGLSL::to_expression_abi_cxx11_((string *)local_48,&this->super_CompilerGLSL,id_00,true);
  uVar1 = ::std::__cxx11::string::find_first_of((char)local_48,0x5b);
  while (uVar2 = ::std::__cxx11::string::find_first_of((char)local_48,0x2e),
        uVar2 != 0xffffffffffffffff && uVar2 < uVar1) {
    puVar3 = (undefined1 *)::std::__cxx11::string::operator[]((ulong)local_48);
    *puVar3 = 0x5f;
  }
  if (uVar1 == 0xffffffffffffffff) {
    ::std::operator+(__return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                     &this->swizzle_name_suffix);
  }
  else {
    ::std::__cxx11::string::substr((ulong)((long)&array_expr.field_2 + 8),(ulong)local_48);
    ::std::__cxx11::string::substr((ulong)local_b0,(ulong)local_48);
    ::std::operator+(&local_d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&array_expr.field_2 + 8),&this->swizzle_name_suffix);
    ::std::operator+(__return_storage_ptr__,&local_d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0);
    ::std::__cxx11::string::~string((string *)&local_d0);
    ::std::__cxx11::string::~string((string *)local_b0);
    ::std::__cxx11::string::~string((string *)(array_expr.field_2._M_local_buf + 8));
  }
  ::std::__cxx11::string::~string((string *)local_48);
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::to_swizzle_expression(uint32_t id)
{
	auto *combined = maybe_get<SPIRCombinedImageSampler>(id);

	auto expr = to_expression(combined ? combined->image : VariableID(id));
	auto index = expr.find_first_of('[');

	// If an image is part of an argument buffer translate this to a legal identifier.
	string::size_type period = 0;
	while ((period = expr.find_first_of('.', period)) != string::npos && period < index)
		expr[period] = '_';

	if (index == string::npos)
		return expr + swizzle_name_suffix;
	else
	{
		auto image_expr = expr.substr(0, index);
		auto array_expr = expr.substr(index);
		return image_expr + swizzle_name_suffix + array_expr;
	}
}